

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# envelope.h
# Opt level: O2

clock_t __thiscall EnvelopeGenerator::clock(EnvelopeGenerator *this)

{
  uint uVar1;
  ulong uVar2;
  reg16 rVar3;
  reg16 rVar4;
  uint uVar5;
  byte bVar6;
  State SVar7;
  int in_ESI;
  reg8 rVar8;
  ulong uVar9;
  int iVar10;
  
  uVar2 = (ulong)this->rate_period;
  uVar5 = this->rate_period - this->rate_counter;
  uVar1 = uVar5 + 0x7fff;
  if (0 < (int)uVar5) {
    uVar1 = uVar5;
  }
  SVar7 = this->state;
  bVar6 = this->hold_zero;
  uVar9 = (ulong)uVar1;
  rVar3 = this->rate_counter;
LAB_0013608d:
  if (in_ESI != 0) {
    iVar10 = in_ESI - (int)uVar9;
    if ((int)uVar9 <= in_ESI) {
      this->rate_counter = 0;
      uVar9 = uVar2;
      in_ESI = iVar10;
      if (SVar7 != ATTACK) goto code_r0x001360a9;
      goto LAB_001360c2;
    }
    uVar1 = rVar3 + in_ESI;
    uVar2 = (ulong)uVar1;
    uVar5 = rVar3 + in_ESI + 1 & 0x7fff;
    if (-1 < (short)uVar1) {
      uVar5 = uVar1;
    }
    this->rate_counter = uVar5;
  }
  return uVar2;
code_r0x001360a9:
  rVar8 = this->exponential_counter + 1;
  this->exponential_counter = rVar8;
  rVar3 = 0;
  if (rVar8 != this->exponential_counter_period) goto LAB_0013608d;
LAB_001360c2:
  this->exponential_counter = 0;
  rVar4 = 0;
  rVar3 = 0;
  if ((bVar6 & 1) != 0) goto LAB_0013608d;
  rVar8 = this->envelope_counter;
  rVar3 = rVar4;
  if (SVar7 == RELEASE) {
    rVar8 = rVar8 - 1 & 0xff;
LAB_0013611c:
    this->envelope_counter = rVar8;
  }
  else if (SVar7 == DECAY_SUSTAIN) {
    if (rVar8 != sustain_level[this->sustain]) {
      rVar8 = rVar8 - 1;
      goto LAB_0013611c;
    }
  }
  else if (SVar7 == ATTACK) {
    rVar8 = rVar8 + 1 & 0xff;
    this->envelope_counter = rVar8;
    if (rVar8 == 0xff) {
      this->state = DECAY_SUSTAIN;
      uVar2 = (ulong)rate_counter_period[this->decay];
      this->rate_period = rate_counter_period[this->decay];
      SVar7 = DECAY_SUSTAIN;
      goto LAB_00136156;
    }
  }
  if (rVar8 == 0) {
    this->exponential_counter_period = 1;
    this->hold_zero = true;
    bVar6 = 1;
    goto LAB_0013608d;
  }
  if (rVar8 == 6) {
    this->exponential_counter_period = 0x1e;
    goto LAB_0013608d;
  }
  if (rVar8 == 0xe) {
    this->exponential_counter_period = 0x10;
    goto LAB_0013608d;
  }
  if (rVar8 == 0x1a) {
    this->exponential_counter_period = 8;
    goto LAB_0013608d;
  }
  if (rVar8 == 0x36) {
    this->exponential_counter_period = 4;
    goto LAB_0013608d;
  }
  if (rVar8 == 0x5d) {
    this->exponential_counter_period = 2;
    goto LAB_0013608d;
  }
  if (rVar8 != 0xff) goto LAB_0013608d;
LAB_00136156:
  this->exponential_counter_period = 1;
  uVar9 = uVar2;
  goto LAB_0013608d;
}

Assistant:

RESID_INLINE
void EnvelopeGenerator::clock(cycle_count delta_t)
{
  // Check for ADSR delay bug.
  // If the rate counter comparison value is set below the current value of the
  // rate counter, the counter will continue counting up until it wraps around
  // to zero at 2^15 = 0x8000, and then count rate_period - 1 before the
  // envelope can finally be stepped.
  // This has been verified by sampling ENV3.
  //

  // NB! This requires two's complement integer.
  int rate_step = rate_period - rate_counter;
  if (rate_step <= 0) {
    rate_step += 0x7fff;
  }

  while (delta_t) {
    if (delta_t < rate_step) {
      rate_counter += delta_t;
      if (rate_counter & 0x8000) {
	++rate_counter &= 0x7fff;
      }
      return;
    }

    rate_counter = 0;
    delta_t -= rate_step;

    // The first envelope step in the attack state also resets the exponential
    // counter. This has been verified by sampling ENV3.
    //
    if (state == ATTACK	|| ++exponential_counter == exponential_counter_period)
    {
      exponential_counter = 0;

      // Check whether the envelope counter is frozen at zero.
      if (hold_zero) {
	rate_step = rate_period;
	continue;
      }

      switch (state) {
      case ATTACK:
	// The envelope counter can flip from 0xff to 0x00 by changing state to
	// release, then to attack. The envelope counter is then frozen at
	// zero; to unlock this situation the state must be changed to release,
	// then to attack. This has been verified by sampling ENV3.
	//
	++envelope_counter &= 0xff;
	if (envelope_counter == 0xff) {
	  state = DECAY_SUSTAIN;
	  rate_period = rate_counter_period[decay];
	}
	break;
      case DECAY_SUSTAIN:
	if (envelope_counter != sustain_level[sustain]) {
	  --envelope_counter;
	}
	break;
      case RELEASE:
	// The envelope counter can flip from 0x00 to 0xff by changing state to
	// attack, then to release. The envelope counter will then continue
	// counting down in the release state.
	// This has been verified by sampling ENV3.
	// NB! The operation below requires two's complement integer.
	//
	--envelope_counter &= 0xff;
	break;
      }

      // Check for change of exponential counter period.
      switch (envelope_counter) {
      case 0xff:
	exponential_counter_period = 1;
	break;
      case 0x5d:
	exponential_counter_period = 2;
	break;
      case 0x36:
	exponential_counter_period = 4;
	break;
      case 0x1a:
	exponential_counter_period = 8;
	break;
      case 0x0e:
	exponential_counter_period = 16;
	break;
      case 0x06:
	exponential_counter_period = 30;
	break;
      case 0x00:
	exponential_counter_period = 1;

	// When the envelope counter is changed to zero, it is frozen at zero.
	// This has been verified by sampling ENV3.
	hold_zero = true;
	break;
      }
    }

    rate_step = rate_period;
  }
}